

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall CClient::PumpNetwork(CClient *this)

{
  CNetClient *this_00;
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  CNetChunk Packet;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &this->m_NetClient;
  CNetClient::Update(this_00);
  uVar1 = (this->super_IClient).m_State;
  if ((5 < uVar1) || ((0x31U >> (uVar1 & 0x1f) & 1) == 0)) {
    iVar3 = CNetClient::State(this_00);
    if (iVar3 == 0) {
      SetState(this,0);
      pcVar4 = CNetClient::ErrorString(this_00);
      DisconnectWithReason(this,pcVar4);
      pcVar4 = CNetClient::ErrorString(this_00);
      str_format((char *)&Packet,0x100,"offline error=\'%s\'",pcVar4);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"client",&Packet,0);
    }
    if (((this->super_IClient).m_State == 1) && (iVar3 = CNetClient::State(this_00), iVar3 == 2)) {
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"client","connected, sending info",0);
      SetState(this,2);
      SendInfo(this);
    }
  }
  while (iVar3 = CNetClient::Recv(this_00,&Packet,(TOKEN *)0x0), iVar3 != 0) {
    if (((byte)Packet.m_Flags & 2) == 0) {
      ProcessServerPacket(this,&Packet);
    }
  }
  CNetClient::Update(&this->m_ContactClient);
  while (iVar3 = CNetClient::Recv(&this->m_ContactClient,&Packet,(TOKEN *)0x0), iVar3 != 0) {
    if (((byte)Packet.m_Flags & 2) != 0) {
      ProcessConnlessPacket(this,&Packet);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CClient::PumpNetwork()
{
	m_NetClient.Update();

	if(State() != IClient::STATE_DEMOPLAYBACK)
	{
		// check for errors
		if(State() != IClient::STATE_OFFLINE && State() != IClient::STATE_QUITING && m_NetClient.State() == NETSTATE_OFFLINE)
		{
			SetState(IClient::STATE_OFFLINE);
			DisconnectWithReason(m_NetClient.ErrorString());
			char aBuf[256];
			str_format(aBuf, sizeof(aBuf), "offline error='%s'", m_NetClient.ErrorString());
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", aBuf);
		}

		//
		if(State() == IClient::STATE_CONNECTING && m_NetClient.State() == NETSTATE_ONLINE)
		{
			// we switched to online
			m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "client", "connected, sending info");
			SetState(IClient::STATE_LOADING);
			SendInfo();
		}
	}

	// process non-connless packets
	CNetChunk Packet;
	while(m_NetClient.Recv(&Packet))
	{
		if(!(Packet.m_Flags&NETSENDFLAG_CONNLESS))
			ProcessServerPacket(&Packet);
	}

	// process connless packets data
	m_ContactClient.Update();
	while(m_ContactClient.Recv(&Packet))
	{
		if(Packet.m_Flags&NETSENDFLAG_CONNLESS)
			ProcessConnlessPacket(&Packet);
	}
}